

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# whisper.cpp
# Opt level: O1

bool whisper_sched_graph_init
               (whisper_sched *allocr,
               vector<ggml_backend_*,_std::allocator<ggml_backend_*>_> *backends,
               function<ggml_cgraph_*()> *get_graph)

{
  pointer ppgVar1;
  char cVar2;
  ggml_backend_sched_t pgVar3;
  long lVar4;
  long lVar5;
  ggml_cgraph *pgVar6;
  
  ppgVar1 = (backends->super__Vector_base<ggml_backend_*,_std::allocator<ggml_backend_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pgVar3 = (ggml_backend_sched_t)
           ggml_backend_sched_new
                     (ppgVar1,0,
                      (ulong)((long)(backends->
                                    super__Vector_base<ggml_backend_*,_std::allocator<ggml_backend_*>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)ppgVar1) >>
                      3,0x1000,0);
  allocr->sched = pgVar3;
  lVar4 = ggml_tensor_overhead();
  lVar5 = ggml_graph_overhead();
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&allocr->meta,lVar4 * 0x1000 + lVar5);
  if ((get_graph->super__Function_base)._M_manager != (_Manager_type)0x0) {
    pgVar3 = allocr->sched;
    pgVar6 = (*get_graph->_M_invoker)((_Any_data *)get_graph);
    cVar2 = ggml_backend_sched_alloc_graph(pgVar3,pgVar6);
    if (cVar2 == '\0') {
      whisper_log_internal
                (GGML_LOG_LEVEL_ERROR,"%s: failed to allocate the compute buffer\n",
                 "whisper_sched_graph_init");
    }
    else {
      ggml_backend_sched_reset(allocr->sched);
    }
    return (bool)cVar2;
  }
  std::__throw_bad_function_call();
}

Assistant:

static bool whisper_sched_graph_init(struct whisper_sched & allocr, std::vector<ggml_backend_t> backends, std::function<struct ggml_cgraph *()> && get_graph) {
    auto & sched = allocr.sched;
    auto & meta  = allocr.meta;

    sched = ggml_backend_sched_new(backends.data(), nullptr, backends.size(), WHISPER_MAX_NODES, false);

    meta.resize(ggml_tensor_overhead()*WHISPER_MAX_NODES + ggml_graph_overhead());

    // since there are dependencies between the different graphs,
    // we need to allocate them instead of only reserving to get the correct compute buffer size
    if (!ggml_backend_sched_alloc_graph(sched, get_graph())) {
        // failed to allocate the compute buffer
        WHISPER_LOG_ERROR("%s: failed to allocate the compute buffer\n", __func__);
        return false;
    }

    ggml_backend_sched_reset(sched);

    return true;
}